

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Secp256k1::MulTweakPubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *pubkey,ByteData *tweak)

{
  pointer *this_00;
  secp256k1_context *psVar1;
  CfdException *pCVar2;
  size_t sVar3;
  uchar *puVar4;
  size_type inputlen;
  allocator local_2d9;
  string local_2d8;
  CfdSourceLocation local_2b8;
  undefined1 local_29a;
  allocator local_299;
  string local_298;
  CfdSourceLocation local_278;
  size_type local_260;
  size_t byte_size;
  undefined1 local_250 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  string local_230;
  CfdSourceLocation local_210;
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0;
  CfdSourceLocation local_1d0;
  uchar auStack_1b8 [8];
  secp256k1_pubkey_conflict watchman;
  undefined1 auStack_170 [8];
  secp256k1_pubkey_conflict tweaked;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_data;
  int ret;
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8;
  CfdSourceLocation local_98;
  undefined1 local_7d;
  allocator local_69;
  string local_68;
  CfdSourceLocation local_48;
  secp256k1_context *local_30;
  secp256k1_context *context;
  ByteData *tweak_local;
  ByteData *pubkey_local;
  Secp256k1 *this_local;
  
  local_30 = (secp256k1_context *)this->secp256k1_context_;
  context = (secp256k1_context *)tweak;
  tweak_local = pubkey;
  pubkey_local = (ByteData *)this;
  this_local = (Secp256k1 *)__return_storage_ptr__;
  if (this->secp256k1_context_ == (void *)0x0) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x14d;
    local_48.funcname = "MulTweakPubkeySecp256k1Ec";
    logger::warn<>(&local_48,"Secp256k1 context is NULL.");
    local_7d = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_68,"Secp256k1 context is NULL.",&local_69);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_68);
    local_7d = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar3 = ByteData::GetDataSize(pubkey);
  if (sVar3 != 0x21) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x152;
    local_98.funcname = "MulTweakPubkeySecp256k1Ec";
    logger::warn<>(&local_98,"Invalid Argument pubkey size.");
    local_ba = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_b8,"Invalid Pubkey size.",&local_b9);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_b8);
    local_ba = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar3 = ByteData::GetDataSize((ByteData *)context);
  if (sVar3 != 0x20) {
    local_d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_d8.filename = local_d8.filename + 1;
    local_d8.line = 0x157;
    local_d8.funcname = "MulTweakPubkeySecp256k1Ec";
    logger::warn<>(&local_d8,"Invalid Argument tweak size.");
    pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&ret,"Invalid tweak size.",
               (allocator *)
               ((long)&pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&ret);
    pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &tweak_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,tweak_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(tweaked.data + 0x38),
                     (ByteData *)context);
  psVar1 = local_30;
  this_00 = &tweak_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  inputlen = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       secp256k1_ec_pubkey_parse(psVar1,(secp256k1_pubkey *)auStack_170,puVar4,inputlen);
  psVar1 = local_30;
  if ((int)pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage != 1) {
    local_1d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_1d0.filename = local_1d0.filename + 1;
    local_1d0.line = 0x164;
    local_1d0.funcname = "MulTweakPubkeySecp256k1Ec";
    logger::warn<int&>(&local_1d0,"secp256k1_ec_pubkey_parse Error.({})",
                       (int *)&pubkey_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1f2 = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1f0,"Secp256k1 pubkey parse Error.",&local_1f1);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_1f0);
    local_1f2 = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  watchman.data[0x28] = tweaked.data[0x28];
  watchman.data[0x29] = tweaked.data[0x29];
  watchman.data[0x2a] = tweaked.data[0x2a];
  watchman.data[0x2b] = tweaked.data[0x2b];
  watchman.data[0x2c] = tweaked.data[0x2c];
  watchman.data[0x2d] = tweaked.data[0x2d];
  watchman.data[0x2e] = tweaked.data[0x2e];
  watchman.data[0x2f] = tweaked.data[0x2f];
  watchman.data[0x30] = tweaked.data[0x30];
  watchman.data[0x31] = tweaked.data[0x31];
  watchman.data[0x32] = tweaked.data[0x32];
  watchman.data[0x33] = tweaked.data[0x33];
  watchman.data[0x34] = tweaked.data[0x34];
  watchman.data[0x35] = tweaked.data[0x35];
  watchman.data[0x36] = tweaked.data[0x36];
  watchman.data[0x37] = tweaked.data[0x37];
  watchman.data[0x18] = tweaked.data[0x18];
  watchman.data[0x19] = tweaked.data[0x19];
  watchman.data[0x1a] = tweaked.data[0x1a];
  watchman.data[0x1b] = tweaked.data[0x1b];
  watchman.data[0x1c] = tweaked.data[0x1c];
  watchman.data[0x1d] = tweaked.data[0x1d];
  watchman.data[0x1e] = tweaked.data[0x1e];
  watchman.data[0x1f] = tweaked.data[0x1f];
  watchman.data[0x20] = tweaked.data[0x20];
  watchman.data[0x21] = tweaked.data[0x21];
  watchman.data[0x22] = tweaked.data[0x22];
  watchman.data[0x23] = tweaked.data[0x23];
  watchman.data[0x24] = tweaked.data[0x24];
  watchman.data[0x25] = tweaked.data[0x25];
  watchman.data[0x26] = tweaked.data[0x26];
  watchman.data[0x27] = tweaked.data[0x27];
  watchman.data[8] = tweaked.data[8];
  watchman.data[9] = tweaked.data[9];
  watchman.data[10] = tweaked.data[10];
  watchman.data[0xb] = tweaked.data[0xb];
  watchman.data[0xc] = tweaked.data[0xc];
  watchman.data[0xd] = tweaked.data[0xd];
  watchman.data[0xe] = tweaked.data[0xe];
  watchman.data[0xf] = tweaked.data[0xf];
  watchman.data[0x10] = tweaked.data[0x10];
  watchman.data[0x11] = tweaked.data[0x11];
  watchman.data[0x12] = tweaked.data[0x12];
  watchman.data[0x13] = tweaked.data[0x13];
  watchman.data[0x14] = tweaked.data[0x14];
  watchman.data[0x15] = tweaked.data[0x15];
  watchman.data[0x16] = tweaked.data[0x16];
  watchman.data[0x17] = tweaked.data[0x17];
  auStack_1b8[0] = auStack_170[0];
  auStack_1b8[1] = auStack_170[1];
  auStack_1b8[2] = auStack_170[2];
  auStack_1b8[3] = auStack_170[3];
  auStack_1b8[4] = auStack_170[4];
  auStack_1b8[5] = auStack_170[5];
  auStack_1b8[6] = auStack_170[6];
  auStack_1b8[7] = auStack_170[7];
  watchman.data[0] = tweaked.data[0];
  watchman.data[1] = tweaked.data[1];
  watchman.data[2] = tweaked.data[2];
  watchman.data[3] = tweaked.data[3];
  watchman.data[4] = tweaked.data[4];
  watchman.data[5] = tweaked.data[5];
  watchman.data[6] = tweaked.data[6];
  watchman.data[7] = tweaked.data[7];
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(tweaked.data + 0x38)
                     );
  pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       secp256k1_ec_pubkey_tweak_mul(psVar1,(secp256k1_pubkey *)auStack_170,puVar4);
  if ((int)pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage != 1) {
    local_210.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_210.filename = local_210.filename + 1;
    local_210.line = 0x16c;
    local_210.funcname = "MulTweakPubkeySecp256k1Ec";
    logger::warn<int&>(&local_210,"secp256k1_ec_pubkey_tweak_add Error.({})",
                       (int *)&pubkey_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_230,"Secp256k1 pubkey tweak Error.",
               (allocator *)
               ((long)&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_230);
    byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&byte_size + 7));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_250,0x41,
             (allocator<unsigned_char> *)((long)&byte_size + 7));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&byte_size + 7));
  local_260 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_250);
  psVar1 = local_30;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_250);
  pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       secp256k1_ec_pubkey_serialize(psVar1,puVar4,&local_260,(secp256k1_pubkey *)auStack_170,0x102)
  ;
  if ((int)pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage != 1) {
    local_278.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_278.filename = local_278.filename + 1;
    local_278.line = 0x177;
    local_278.funcname = "MulTweakPubkeySecp256k1Ec";
    logger::warn<int&>(&local_278,"secp256k1_ec_pubkey_serialize Error.({})",
                       (int *)&pubkey_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_29a = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_298,"Secp256k1 pubkey serialize Error.",&local_299);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_298);
    local_29a = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_260 != 0x21) {
    local_2b8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_2b8.filename = local_2b8.filename + 1;
    local_2b8.line = 0x17f;
    local_2b8.funcname = "MulTweakPubkeySecp256k1Ec";
    logger::warn<unsigned_long&>
              (&local_2b8,"secp256k1_ec_pubkey_serialize pubkey length Error.({})",&local_260);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2d8,"Secp256k1 pubkey length Error.",&local_2d9)
    ;
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_2d8);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_250,0x21);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_250);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_250);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(tweaked.data + 0x38));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &tweak_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

ByteData Secp256k1::MulTweakPubkeySecp256k1Ec(
    const ByteData& pubkey, const ByteData& tweak) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (pubkey.GetDataSize() != kCompressedPubkeyByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }
  if (tweak.GetDataSize() != kTweakByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument tweak size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid tweak size.");
  }

  int ret;
  std::vector<uint8_t> pubkey_data = pubkey.GetBytes();
  std::vector<uint8_t> tweak_data = tweak.GetBytes();
  secp256k1_pubkey tweaked;
  secp256k1_pubkey watchman;
  ret = secp256k1_ec_pubkey_parse(
      context, &tweaked, pubkey_data.data(), pubkey_data.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
  }
  memcpy(&watchman, &tweaked, sizeof(watchman));

  ret = secp256k1_ec_pubkey_tweak_mul(context, &tweaked, tweak_data.data());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_tweak_add Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey tweak Error.");
  }

  std::vector<uint8_t> byte_data(kFullPubkeyByteSize);
  size_t byte_size = byte_data.size();
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &tweaked,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_serialize Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  if (byte_size != kCompressedPubkeyByteSize) {
    warn(
        CFD_LOG_SOURCE,
        "secp256k1_ec_pubkey_serialize pubkey length Error.({})", byte_size);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey length Error.");
  }
  byte_data.resize(byte_size);
  return ByteData(byte_data);
}